

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O0

void __thiscall iDynTree::DummyEnvironment::~DummyEnvironment(DummyEnvironment *this)

{
  DummyLight *in_RDI;
  
  (in_RDI->super_ILight)._vptr_ILight = (_func_int **)&PTR__DummyEnvironment_00110628;
  DummyLight::~DummyLight(in_RDI);
  IEnvironment::~IEnvironment((IEnvironment *)in_RDI);
  return;
}

Assistant:

virtual ~DummyEnvironment() {}